

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

void nni_dialer_bump_error(nni_dialer *d,int err)

{
  int err_local;
  nni_dialer *d_local;
  
  switch(err) {
  case 2:
    nni_stat_inc(&d->st_oom,1);
    break;
  default:
    nni_stat_inc(&d->st_other,1);
    break;
  case 5:
    nni_stat_inc(&d->st_timeout,1);
    break;
  case 6:
    nni_stat_inc(&d->st_refused,1);
    break;
  case 7:
    break;
  case 0xd:
    nni_stat_inc(&d->st_proto,1);
    break;
  case 0x12:
  case 0x13:
    nni_stat_inc(&d->st_disconnect,1);
    break;
  case 0x14:
    nni_stat_inc(&d->st_canceled,1);
    break;
  case 0x1a:
  case 0x1b:
    nni_stat_inc(&d->st_auth,1);
  }
  return;
}

Assistant:

void
nni_dialer_bump_error(nni_dialer *d, int err)
{
#ifdef NNG_ENABLE_STATS
	switch (err) {
	case NNG_ECONNABORTED:
	case NNG_ECONNRESET:
		nni_stat_inc(&d->st_disconnect, 1);
		break;
	case NNG_ECONNREFUSED:
		nni_stat_inc(&d->st_refused, 1);
		break;
	case NNG_ECANCELED:
		nni_stat_inc(&d->st_canceled, 1);
		break;
	case NNG_ETIMEDOUT:
		nni_stat_inc(&d->st_timeout, 1);
		break;
	case NNG_EPROTO:
		nni_stat_inc(&d->st_proto, 1);
		break;
	case NNG_EPEERAUTH:
	case NNG_ECRYPTO:
		nni_stat_inc(&d->st_auth, 1);
		break;
	case NNG_ENOMEM:
		nni_stat_inc(&d->st_oom, 1);
		break;
	case NNG_ECLOSED:
		// do nothing.
		break;
	default:
		nni_stat_inc(&d->st_other, 1);
		break;
	}
#else
	NNI_ARG_UNUSED(d);
	NNI_ARG_UNUSED(err);
#endif
}